

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O1

Iso_Man_t * Iso_ManStart(Aig_Man_t *pAig)

{
  uint uVar1;
  Iso_Man_t *pIVar2;
  Iso_Obj_t *pIVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  pIVar2 = (Iso_Man_t *)calloc(1,0x78);
  pIVar2->pAig = pAig;
  iVar9 = pAig->vObjs->nSize;
  pIVar2->nObjs = iVar9;
  pIVar3 = (Iso_Obj_t *)calloc((long)iVar9,0x18);
  pIVar2->pObjs = pIVar3;
  uVar7 = iVar9 - 1;
  while( true ) {
    do {
      uVar8 = uVar7 + 1;
      uVar1 = uVar7 & 1;
      uVar7 = uVar8;
    } while (uVar1 != 0);
    if (uVar8 < 9) break;
    iVar9 = 5;
    while (uVar8 % (iVar9 - 2U) != 0) {
      uVar1 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar8 < uVar1) goto LAB_006288b2;
    }
  }
LAB_006288b2:
  pIVar2->nBins = uVar8;
  piVar4 = (int *)calloc((long)(int)uVar8,4);
  pIVar2->pBins = piVar4;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  pIVar2->vSingles = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  pIVar2->vClasses = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  pIVar2->vTemp1 = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  pIVar2->vTemp2 = pVVar5;
  pIVar2->nObjIds = 1;
  return pIVar2;
}

Assistant:

Iso_Man_t * Iso_ManStart( Aig_Man_t * pAig )
{
    Iso_Man_t * p;
    p = ABC_CALLOC( Iso_Man_t, 1 );
    p->pAig     = pAig;
    p->nObjs    = Aig_ManObjNumMax( pAig );
    p->pObjs    = ABC_CALLOC( Iso_Obj_t, p->nObjs );
    p->nBins    = Abc_PrimeCudd( p->nObjs );
    p->pBins    = ABC_CALLOC( int, p->nBins );    
    p->vSingles = Vec_PtrAlloc( 1000 );
    p->vClasses = Vec_PtrAlloc( 1000 );
    p->vTemp1   = Vec_PtrAlloc( 1000 );
    p->vTemp2   = Vec_PtrAlloc( 1000 );
    p->nObjIds  = 1;
    return p;
}